

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_typed_timesamples<tinyusdz::Extent>
                   (string *__return_storage_ptr__,TypedTimeSamples<tinyusdz::Extent> *v,
                   uint32_t indent)

{
  pointer pSVar1;
  Extent v_00;
  string *psVar2;
  ostream *poVar3;
  uint32_t n;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined8 extraout_RDX_01;
  ulong uVar5;
  long lVar6;
  stringstream ss;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"{\n",2);
  uVar4 = extraout_RDX;
  if (v->_dirty == true) {
    TypedTimeSamples<tinyusdz::Extent>::update(v);
    uVar4 = extraout_RDX_00;
  }
  n = (uint32_t)uVar4;
  if ((v->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (v->_samples).
      super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0x20;
    uVar5 = 0;
    do {
      pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)(ulong)(indent + 1),(uint32_t)uVar4);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      poVar3 = ::std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)&(((v->_samples).
                                     super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->value).lower +
                           lVar6 + 0xffffffffffffffd8U));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      pSVar1 = (v->_samples).
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(char *)((long)&(pSVar1->value).lower + lVar6 + -8) == '\x01') {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"None",4);
      }
      else {
        v_00.upper._M_elems._4_8_ =
             *(undefined8 *)((long)&(pSVar1->value).lower + lVar6 + 0xfffffffffffffff0U);
        v_00._0_16_ = *(undefined1 (*) [16])
                       ((long)&(pSVar1->value).lower + lVar6 + 0xffffffffffffffe0U);
        ::std::operator<<(local_1a8,v_00);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",\n",2);
      n = (uint32_t)extraout_RDX_01;
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x28;
      uVar4 = extraout_RDX_01;
    } while (uVar5 < (ulong)(((long)(v->_samples).
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(v->_samples).
                                    super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::Extent>::Sample>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333));
  }
  pprint::Indent_abi_cxx11_(&local_1e0,(pprint *)CONCAT44(in_register_00000014,indent),n);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  psVar2 = local_1c0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string print_typed_timesamples(const TypedTimeSamples<T> &v,
                                    const uint32_t indent = 0) {
  std::stringstream ss;

  ss << "{\n";

  const auto &samples = v.get_samples();

  for (size_t i = 0; i < samples.size(); i++) {
    ss << pprint::Indent(indent + 1) << samples[i].t << ": ";
    if (samples[i].blocked) {
      ss << "None";
    } else {
      ss << samples[i].value;
    }
    ss << ",\n";
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}